

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O3

void CCamera::ConSetPosition(IResult *pResult,void *pUserData)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  uVar1 = (*pResult->_vptr_IResult[2])(pResult,0);
  uVar4 = 9;
  if (uVar1 < 9) {
    uVar4 = uVar1;
  }
  if ((int)uVar1 < 0) {
    uVar4 = 0;
  }
  iVar2 = (*pResult->_vptr_IResult[2])(pResult,1);
  iVar3 = (*pResult->_vptr_IResult[2])(pResult,2);
  *(ulong *)((long)pUserData + (ulong)uVar4 * 8 + 0x38) =
       CONCAT44((float)iVar3 * 32.0 + 16.0,(float)iVar2 * 32.0 + 16.0);
  if ((*(uint *)((long)pUserData + 0x88) == uVar4) &&
     (*(int *)(*(long *)(*(long *)((long)pUserData + 8) + 0x858) + 0x10) != 3)) {
    *(undefined8 *)((long)pUserData + 0x8c) = *(undefined8 *)((long)pUserData + 0x10);
    *(undefined8 *)((long)pUserData + 0x20) =
         *(undefined8 *)((long)pUserData + (ulong)uVar4 * 8 + 0x38);
    *(uint *)((long)pUserData + 0x88) = uVar4;
    *(undefined4 *)((long)pUserData + 0x94) = 0;
  }
  return;
}

Assistant:

void CCamera::ConSetPosition(IConsole::IResult *pResult, void *pUserData)
{
	CCamera *pSelf = (CCamera *)pUserData;
	int PositionNumber = clamp(pResult->GetInteger(0), 0, NUM_POS-1);
	vec2 Position = vec2(pResult->GetInteger(1)*32.0f+16.0f, pResult->GetInteger(2)*32.0f+16.0f);
	pSelf->m_Positions[PositionNumber] = Position;

	// update
	if(pSelf->GetCurrentPosition() == PositionNumber)
		pSelf->ChangePosition(PositionNumber);
}